

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O0

void google::protobuf::compiler::MockCodeGenerator::ExpectGenerated
               (string_view name,string_view parameter,string_view insertions,string_view file,
               string_view first_message_name,string_view first_parsed_file_name,
               string_view output_directory)

{
  string_view s;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  bool bVar2;
  char *pcVar3;
  LogMessage *pLVar4;
  size_type sVar5;
  reference pvVar6;
  char *message;
  char *pcVar7;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  _Var8;
  AlphaNum *pAVar9;
  MockCodeGenerator *this;
  undefined1 auVar10 [16];
  string_view generator_name;
  string_view generator_name_00;
  string_view generator_name_01;
  string_view generator_name_02;
  string_view file_00;
  string_view parameter_00;
  string_view parameter_01;
  string_view parameter_02;
  byte local_599;
  Status *local_580;
  AssertHelper local_548;
  Message local_540;
  size_t local_538;
  char *pcStack_530;
  size_t local_528;
  char *pcStack_520;
  size_t local_518;
  char *pcStack_510;
  basic_string_view<char,_std::char_traits<char>_> local_508;
  undefined1 local_4f8 [16];
  string local_4e8;
  AlphaNum local_4c8;
  AlphaNum local_498;
  string local_468;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_5;
  Message local_430;
  size_t local_428;
  char *pcStack_420;
  size_t local_418;
  char *pcStack_410;
  size_t local_408;
  char *pcStack_400;
  basic_string_view<char,_std::char_traits<char>_> local_3f0;
  undefined1 local_3e0 [16];
  string local_3d0;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_4;
  size_t i_1;
  Message local_390;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_3;
  Message local_370;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_2;
  Message local_350;
  size_t local_348;
  char *pcStack_340;
  size_t local_338;
  char *pcStack_330;
  size_t local_328;
  char *pcStack_320;
  char *local_318;
  char *pcStack_310;
  MockCodeGenerator *local_308;
  char *pcStack_300;
  string local_2f0;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_1;
  Message local_2b8;
  unsigned_long local_2b0;
  size_type local_2a8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar;
  ConvertibleToStringView local_278;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  undefined1 local_238 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertion_list;
  ulong local_1f0;
  size_t i;
  ConvertibleToStringView local_1e0;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_1d0;
  undefined1 local_1b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  Voidify local_189;
  size_t local_188;
  char *pcStack_180;
  MockCodeGenerator *local_178;
  char *pcStack_170;
  string local_168;
  AlphaNum local_148;
  AlphaNum local_118;
  size_t local_e8;
  char *pcStack_e0;
  AlphaNum local_d0;
  string local_a0;
  undefined1 local_80 [32];
  pair<const_absl::lts_20250127::Status_*,_const_char_*> absl_log_internal_check_ok_goo;
  string content;
  string_view insertions_local;
  string_view parameter_local;
  string_view name_local;
  
  content.field_2._8_8_ = insertions._M_len;
  pcVar7 = name._M_str;
  this = (MockCodeGenerator *)name._M_len;
  pcVar3 = insertions._M_str;
  std::__cxx11::string::string((string *)&absl_log_internal_check_ok_goo.second);
  std::pair<const_absl::lts_20250127::Status_*,_const_char_*>::
  pair<const_absl::lts_20250127::Status_*,_const_char_*,_true>
            ((pair<const_absl::lts_20250127::Status_*,_const_char_*> *)(local_80 + 0x18));
  local_e8 = output_directory._M_len;
  pcStack_e0 = output_directory._M_str;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_d0,output_directory);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_118,"/");
  local_188 = file._M_len;
  pcStack_180 = file._M_str;
  generator_name._M_str = (char *)file._M_len;
  generator_name._M_len = (size_t)pcVar7;
  file_00._M_str = pcVar3;
  file_00._M_len = (size_t)file._M_str;
  pAVar9 = (AlphaNum *)file._M_str;
  local_178 = this;
  pcStack_170 = pcVar7;
  GetOutputFileName_abi_cxx11_(&local_168,this,generator_name,file_00);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_148,&local_168);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_a0,(lts_20250127 *)&local_d0,&local_118,&local_148,pAVar9);
  File::GetContents((string *)local_80,&local_a0,
                    (bool)((char)&absl_log_internal_check_ok_goo + '\b'));
  local_80._24_8_ = absl::lts_20250127::log_internal::AsStatus((Status *)local_80);
  bVar2 = absl::lts_20250127::Status::ok((Status *)local_80._24_8_);
  if (bVar2) {
    local_580 = (Status *)0x0;
  }
  else {
    local_580 = (Status *)
                absl::lts_20250127::status_internal::MakeCheckFailString
                          ((Nonnull<const_absl::Status_*>)local_80._24_8_,
                           "File::GetContents( absl::StrCat(output_directory, \"/\", GetOutputFileName(name, file)), &content, true) is OK"
                          );
  }
  absl_log_internal_check_ok_goo.first = local_580;
  bVar2 = absl::lts_20250127::Status::ok((Status *)local_80._24_8_);
  absl::lts_20250127::Status::~Status((Status *)local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_168);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    pcVar3 = absl::lts_20250127::implicit_cast<char_const*>
                       ((type_identity_t<const_char_*>)absl_log_internal_check_ok_goo.first);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)
               &lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0x7c,pcVar3);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)
                        &lines.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_189,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)
               &lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
            (&local_1e0,(string *)&absl_log_internal_check_ok_goo.second);
  absl::lts_20250127::StrSplit<char,absl::lts_20250127::SkipEmpty>
            (&local_1d0,(lts_20250127 *)local_1e0.value_._M_len,local_1e0.value_._M_str,10);
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1b8,&local_1d0);
  while( true ) {
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b8);
    local_599 = 0;
    if (!bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1b8);
      local_599 = std::__cxx11::string::empty();
    }
    if ((local_599 & 1) == 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b8);
  }
  for (local_1f0 = 0;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1b8), local_1f0 < sVar5; local_1f0 = local_1f0 + 1) {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1b8,local_1f0);
    absl::lts_20250127::AlphaNum::AlphaNum
              ((AlphaNum *)
               &insertion_list.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"\n");
    absl::lts_20250127::StrAppend
              (pvVar6,(AlphaNum *)
                      &insertion_list.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_238);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     ((long)&content.field_2 + 8));
  if (!bVar2) {
    s._M_str = insertions._M_str;
    s._M_len = content.field_2._8_8_;
    absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
              (&local_278,s);
    absl::lts_20250127::StrSplit<char,absl::lts_20250127::SkipEmpty>
              (&local_268,(lts_20250127 *)local_278.value_._M_len,local_278.value_._M_str,0x2c);
    absl::lts_20250127::strings_internal::
    Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
              (&local_250,&local_268);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_238,&local_250);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_250);
  }
  local_2a8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1b8);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_238);
  local_2b0 = sVar5 * 2 + 3;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_2a0,"lines.size()","3 + insertion_list.size() * 2",&local_2a8,
             &local_2b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar2) {
    testing::Message::Message(&local_2b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0x8d,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  local_328 = file._M_len;
  pcStack_320 = file._M_str;
  local_338 = first_parsed_file_name._M_len;
  pcStack_330 = first_parsed_file_name._M_str;
  local_348 = first_message_name._M_len;
  pcStack_340 = first_message_name._M_str;
  generator_name_00._M_str = (char *)parameter._M_len;
  generator_name_00._M_len = (size_t)pcVar7;
  parameter_00._M_str = pcVar3;
  parameter_00._M_len = (size_t)parameter._M_str;
  local_318 = (char *)parameter._M_len;
  pcStack_310 = parameter._M_str;
  local_308 = this;
  pcStack_300 = pcVar7;
  GetOutputFileContent_abi_cxx11_
            (&local_2f0,this,generator_name_00,parameter_00,file,first_parsed_file_name,
             first_message_name);
  pvVar6 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_2d0,
             "GetOutputFileContent(name, parameter, file, first_parsed_file_name, first_message_name)"
             ,"lines[0]",&local_2f0,pvVar6);
  std::__cxx11::string::~string((string *)&local_2f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar2) {
    testing::Message::Message(&local_350);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0x90,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_238);
  pvVar6 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,sVar5 + 1);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_368,"kFirstInsertionPoint","lines[1 + insertion_list.size()]",
             (basic_string_view<char,_std::char_traits<char>_> *)
             compiler::(anonymous_namespace)::kFirstInsertionPoint,pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar2) {
    testing::Message::Message(&local_370);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0x92,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_238);
  pvVar6 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,sVar5 * 2 + 2);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_388,"kSecondInsertionPoint","lines[2 + insertion_list.size() * 2]",
             (basic_string_view<char,_std::char_traits<char>_> *)
             compiler::(anonymous_namespace)::kSecondInsertionPoint,pvVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar2) {
    testing::Message::Message(&local_390);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0x93,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i_1,&local_390);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  gtest_ar_4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  while( true ) {
    uVar1._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         gtest_ar_4.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    _Var8.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_238);
    if ((ulong)_Var8.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl <=
        (ulong)uVar1._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl) break;
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_238,
                          (size_type)
                          gtest_ar_4.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
    auVar10 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar6);
    local_3e0 = auVar10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_3f0,"first_insert");
    local_408 = file._M_len;
    pcStack_400 = file._M_str;
    local_418 = file._M_len;
    pcStack_410 = file._M_str;
    local_428 = first_message_name._M_len;
    pcStack_420 = first_message_name._M_str;
    generator_name_01._M_str = (char *)local_3f0._M_len;
    generator_name_01._M_len = local_3e0._8_8_;
    parameter_01._M_str = pcVar3;
    parameter_01._M_len = (size_t)local_3f0._M_str;
    GetOutputFileContent_abi_cxx11_
              (&local_3d0,(MockCodeGenerator *)local_3e0._0_8_,generator_name_01,parameter_01,file,
               file,first_message_name);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1b8,
                          (long)gtest_ar_4.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 1);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_3b0,
               "GetOutputFileContent(insertion_list[i], \"first_insert\", file, file, first_message_name)"
               ,"lines[1 + i]",&local_3d0,pvVar6);
    std::__cxx11::string::~string((string *)&local_3d0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
    if (!bVar2) {
      testing::Message::Message(&local_430);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0x98,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_430);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_430);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_498,"  ");
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_238,
                          (size_type)
                          gtest_ar_4.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
    auVar10 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar6);
    local_4f8 = auVar10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_508,"second_insert");
    local_518 = file._M_len;
    pcStack_510 = file._M_str;
    local_528 = file._M_len;
    pcStack_520 = file._M_str;
    local_538 = first_message_name._M_len;
    pcStack_530 = first_message_name._M_str;
    generator_name_02._M_str = (char *)local_508._M_len;
    generator_name_02._M_len = local_4f8._8_8_;
    parameter_02._M_str = pcVar3;
    parameter_02._M_len = (size_t)local_508._M_str;
    pAVar9 = (AlphaNum *)local_508._M_len;
    GetOutputFileContent_abi_cxx11_
              (&local_4e8,(MockCodeGenerator *)local_4f8._0_8_,generator_name_02,parameter_02,file,
               file,first_message_name);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_4c8,&local_4e8);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_468,(lts_20250127 *)&local_498,&local_4c8,pAVar9);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_238);
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1b8,
                          sVar5 + 2 +
                          (long)gtest_ar_4.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_448,
               "absl::StrCat( \"  \", GetOutputFileContent(insertion_list[i], \"second_insert\", file, file, first_message_name))"
               ,"lines[2 + insertion_list.size() + i]",&local_468,pvVar6);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_4e8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
    if (!bVar2) {
      testing::Message::Message(&local_540);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
      testing::internal::AssertHelper::AssertHelper
                (&local_548,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0x9e,pcVar7);
      testing::internal::AssertHelper::operator=(&local_548,&local_540);
      testing::internal::AssertHelper::~AssertHelper(&local_548);
      testing::Message::~Message(&local_540);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
    gtest_ar_4.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )((long)gtest_ar_4.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1b8);
  std::__cxx11::string::~string((string *)&absl_log_internal_check_ok_goo.second);
  return;
}

Assistant:

void MockCodeGenerator::ExpectGenerated(
    absl::string_view name, absl::string_view parameter,
    absl::string_view insertions, absl::string_view file,
    absl::string_view first_message_name,
    absl::string_view first_parsed_file_name,
    absl::string_view output_directory) {
  std::string content;
  ABSL_CHECK_OK(File::GetContents(
      absl::StrCat(output_directory, "/", GetOutputFileName(name, file)),
      &content, true));

  std::vector<std::string> lines =
      absl::StrSplit(content, '\n', absl::SkipEmpty());

  while (!lines.empty() && lines.back().empty()) {
    lines.pop_back();
  }
  for (size_t i = 0; i < lines.size(); i++) {
    absl::StrAppend(&lines[i], "\n");
  }

  std::vector<std::string> insertion_list;
  if (!insertions.empty()) {
    insertion_list = absl::StrSplit(insertions, ',', absl::SkipEmpty());
  }

  EXPECT_EQ(lines.size(), 3 + insertion_list.size() * 2);
  EXPECT_EQ(GetOutputFileContent(name, parameter, file, first_parsed_file_name,
                                 first_message_name),
            lines[0]);

  EXPECT_EQ(kFirstInsertionPoint, lines[1 + insertion_list.size()]);
  EXPECT_EQ(kSecondInsertionPoint, lines[2 + insertion_list.size() * 2]);

  for (size_t i = 0; i < insertion_list.size(); i++) {
    EXPECT_EQ(GetOutputFileContent(insertion_list[i], "first_insert", file,
                                   file, first_message_name),
              lines[1 + i]);
    // Second insertion point is indented, so the inserted text should
    // automatically be indented too.
    EXPECT_EQ(absl::StrCat(
                  "  ", GetOutputFileContent(insertion_list[i], "second_insert",
                                             file, file, first_message_name)),
              lines[2 + insertion_list.size() + i]);
  }
}